

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  GetterXsYs<unsigned_int> *pGVar6;
  GetterXsYs<unsigned_int> *pGVar7;
  ImDrawVert *pIVar8;
  uint *puVar9;
  uint uVar10;
  long lVar11;
  ImPlotContext *gp;
  long lVar12;
  ImVec2 IVar13;
  undefined1 auVar14 [16];
  double dVar15;
  ImVec2 IVar16;
  double dVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  
  pGVar6 = this->Getter1;
  pGVar7 = this->Getter2;
  iVar3 = pGVar6->Count;
  lVar12 = (long)(((pGVar6->Offset + prim + 1) % iVar3 + iVar3) % iVar3) * (long)pGVar6->Stride;
  iVar3 = this->Transformer->YAxis;
  iVar4 = pGVar7->Count;
  IVar13 = GImPlot->PixelRange[iVar3].Min;
  dVar15 = (double)IVar13.x;
  dVar17 = (double)IVar13.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar3].Range.Min;
  lVar11 = (long)(((prim + 1 + pGVar7->Offset) % iVar4 + iVar4) % iVar4) * (long)pGVar7->Stride;
  auVar14._4_4_ = 0;
  auVar14._0_4_ = *(uint *)((long)pGVar6->Xs + lVar12);
  auVar14._8_4_ = *(uint *)((long)pGVar6->Ys + lVar12);
  auVar14._12_4_ = 0;
  IVar13.x = (float)(((SUB168(auVar14 | _DAT_004a9740,0) - (double)DAT_004a9740) - dVar1) *
                     GImPlot->Mx + dVar15);
  IVar13.y = (float)(((SUB168(auVar14 | _DAT_004a9740,8) - DAT_004a9740._8_8_) - dVar2) *
                     GImPlot->My[iVar3] + dVar17);
  auVar28._4_4_ = 0;
  auVar28._0_4_ = *(uint *)((long)pGVar7->Xs + lVar11);
  auVar28._8_4_ = *(uint *)((long)pGVar7->Ys + lVar11);
  auVar28._12_4_ = 0;
  IVar16.x = (float)(((SUB168(auVar28 | _DAT_004a9740,0) - (double)DAT_004a9740) - dVar1) *
                     GImPlot->Mx + dVar15);
  IVar16.y = (float)(((SUB168(auVar28 | _DAT_004a9740,8) - DAT_004a9740._8_8_) - dVar2) *
                     GImPlot->My[iVar3] + dVar17);
  fVar21 = (this->P12).x;
  fVar22 = (this->P12).y;
  fVar24 = (this->P11).x;
  fVar25 = (this->P11).y;
  fVar18 = IVar13.y * fVar24 - IVar13.x * fVar25;
  fVar26 = fVar21 * IVar16.y - fVar22 * IVar16.x;
  fVar24 = fVar24 - IVar13.x;
  fVar21 = fVar21 - IVar16.x;
  fVar23 = fVar22 - IVar16.y;
  fVar27 = fVar23 * fVar24 - (fVar25 - IVar13.y) * fVar21;
  auVar19._0_4_ = fVar18 * fVar21 - fVar26 * fVar24;
  auVar19._4_4_ = fVar18 * fVar23 - fVar26 * (fVar25 - IVar13.y);
  auVar19._8_4_ = IVar13.y * 0.0 - fVar22 * 0.0;
  auVar19._12_4_ = IVar13.y * 0.0 - fVar22 * 0.0;
  auVar20._4_4_ = fVar27;
  auVar20._0_4_ = fVar27;
  auVar20._8_4_ = fVar23;
  auVar20._12_4_ = fVar23;
  auVar20 = divps(auVar19,auVar20);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8->col = this->Col;
  pIVar8[1].pos = IVar13;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[1].col = this->Col;
  pIVar8[2].pos = auVar20._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[2].col = this->Col;
  pIVar8[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[3].col = this->Col;
  pIVar8[4].pos = IVar16;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar8 = DrawList->_VtxWritePtr;
  pIVar8[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar8 + 5;
  uVar5 = DrawList->_VtxCurrentIdx;
  puVar9 = DrawList->_IdxWritePtr;
  *puVar9 = uVar5;
  uVar10 = -(uint)(IVar16.y < IVar13.y && fVar25 < fVar22 || fVar22 < fVar25 && IVar13.y < IVar16.y)
           & 1;
  puVar9[1] = uVar5 + uVar10 + 1;
  puVar9[2] = DrawList->_VtxCurrentIdx + 3;
  puVar9[3] = DrawList->_VtxCurrentIdx + 1;
  puVar9[4] = (uVar10 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar9[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar9 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  this->P11 = IVar13;
  this->P12 = IVar16;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }